

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
CreateBCGeoEl(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
              *this,int side,int bc)

{
  long size;
  undefined1 auVar1 [16];
  int iVar2;
  MElementType MVar3;
  ostream *poVar4;
  TPZGeoEl *pTVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  TPZStack<int,_10> LowAllSides;
  TPZManVector<int,_27> mapside;
  int local_11c;
  initializer_list<int> local_118;
  TPZManVector<int,_10> local_108;
  TPZManVector<int,_27> local_c0;
  long lVar9;
  
  if ((uint)side < 7) {
    local_11c = side + -3;
    iVar2 = pztopology::TPZTriangle::GetSideOrient(&local_11c);
    MVar3 = pztopology::TPZTriangle::Type(side);
    pztopology::TPZTriangle::NSideNodes(side);
    if (EQuadrilateral < MVar3) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                 ,0x124);
    }
    size = *(long *)(&DAT_0151f750 + (ulong)MVar3 * 8);
    local_108.super_TPZVec<int>._vptr_TPZVec =
         (_func_int **)((ulong)local_108.super_TPZVec<int>._vptr_TPZVec._4_4_ << 0x20);
    TPZManVector<int,_27>::TPZManVector(&local_c0,size,(int *)&local_108);
    auVar1 = _DAT_014d28c0;
    lVar6 = size + -1;
    auVar7._8_4_ = (int)lVar6;
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar7 = auVar7 ^ _DAT_014d28c0;
    auVar8 = _DAT_014d28b0;
    do {
      auVar10 = auVar8 ^ auVar1;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        local_c0.super_TPZVec<int>.fStore[lVar6] = (int)lVar6;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        local_c0.super_TPZVec<int>.fStore[lVar6 + 1] = (int)lVar6 + 1;
      }
      lVar6 = lVar6 + 2;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
    } while (size + 1 != lVar6);
    if (iVar2 == -1) {
      if (MVar3 == EQuadrilateral) {
        local_118._M_array = (iterator)&local_108;
        local_108.super_TPZVec<int>.fNElements._0_4_ = 7;
        local_108.super_TPZVec<int>.fNElements._4_4_ = 6;
        local_108.super_TPZVec<int>.fNAlloc._0_4_ = 5;
        local_108.super_TPZVec<int>.fNAlloc._4_4_ = 4;
        local_108.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x300000000;
        local_108.super_TPZVec<int>.fStore._0_4_ = 2;
        local_108.super_TPZVec<int>.fStore._4_4_ = 1;
        local_108.fExtAlloc[0] = 8;
        local_118._M_len = 9;
        TPZManVector<int,_27>::operator=(&local_c0,&local_118);
      }
      else if (MVar3 == ETriangle) {
        local_118._M_array = (iterator)&local_108;
        local_108.super_TPZVec<int>.fNElements._0_4_ = 4;
        local_108.super_TPZVec<int>.fNElements._4_4_ = 3;
        local_108.super_TPZVec<int>.fNAlloc._0_4_ = 6;
        local_108.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x200000000;
        local_108.super_TPZVec<int>.fStore._0_4_ = 1;
        local_108.super_TPZVec<int>.fStore._4_4_ = 5;
        local_118._M_len = 7;
        TPZManVector<int,_27>::operator=(&local_c0,&local_118);
      }
      else if (MVar3 == EOned) {
        local_108.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&local_118;
        local_118._M_array = (iterator)0x1;
        local_118._M_len = CONCAT44(local_118._M_len._4_4_,2);
        local_108.super_TPZVec<int>.fStore._0_4_ = 3;
        local_108.super_TPZVec<int>.fStore._4_4_ = 0;
        TPZManVector<int,_27>::operator=(&local_c0,(initializer_list<int> *)&local_108);
      }
    }
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_108);
    pztopology::TPZTriangle::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_108);
    TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_108,side);
    pTVar5 = (TPZGeoEl *)
             (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2e0))(this,side,bc,&local_c0);
    TPZManVector<int,_10>::~TPZManVector(&local_108);
    if (local_c0.super_TPZVec<int>.fStore != local_c0.fExtAlloc) {
      local_c0.super_TPZVec<int>.fNAlloc = 0;
      local_c0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_c0.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(local_c0.super_TPZVec<int>.fStore);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n (",3);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,")::CreateBCGeoEl unexpected side = ",0x23);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,side);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    pTVar5 = (TPZGeoEl *)0x0;
  }
  return pTVar5;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}